

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

double __thiscall VertexClustering::totalEnergy(VertexClustering *this)

{
  pointer ppVVar1;
  int i;
  ulong uVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  
  dVar3 = 0.0;
  uVar2 = 0;
  while( true ) {
    ppVVar1 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3) <= uVar2)
    break;
    (*ppVVar1[uVar2]->_vptr_VCCluster[4])();
    dVar3 = dVar3 + extraout_XMM0_Qa;
    uVar2 = uVar2 + 1;
  }
  return dVar3;
}

Assistant:

double VertexClustering::totalEnergy() {
	double energy = 0;
	for (int i = 0; i < clusters.size(); ++i) {
		energy += clusters[i]->energy();
	}
	return energy;
}